

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O2

bool sc_dt::operator==(uint64 u,sc_signed *v)

{
  int iVar1;
  bool bVar2;
  sc_digit ud [3];
  
  from_uint<unsigned_long_long>(3,ud,u);
  if (v->sgn == (uint)(u != 0)) {
    iVar1 = vec_skip_and_cmp(3,ud,v->ndigits,v->digit);
    bVar2 = iVar1 == 0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
operator==(uint64 u, const sc_signed& v)
{

  CONVERT_INT64(u);

  if (us != v.sgn)
    return false;

  if (vec_skip_and_cmp(DIGITS_PER_INT64, ud, v.ndigits, v.digit) != 0)
    return false;

  return true;

}